

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_POW(Context *ctx)

{
  char local_118 [8];
  char buf [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  Context *ctx_local;
  
  if ((ctx->source_args[0].src_mod == SRCMOD_NONE) ||
     (ctx->source_args[0].src_mod == SRCMOD_ABSNEGATE)) {
    ctx->source_args[0].src_mod = SRCMOD_ABS;
  }
  make_ARB1_destarg_string(ctx,src0 + 0x38,0x40);
  make_ARB1_srcarg_string(ctx,0,src1 + 0x38,0x40);
  make_ARB1_srcarg_string(ctx,1,buf + 0x38,0x40);
  if (ctx->source_args[0].src_mod == SRCMOD_ABS) {
    output_line(ctx,"POW%s, %s, %s;",src0 + 0x38,src1 + 0x38,buf + 0x38);
  }
  else {
    allocate_ARB1_scratch_reg_name(ctx,local_118,0x40);
    output_line(ctx,"ABS %s, %s;",local_118,src1 + 0x38);
    output_line(ctx,"POW%s, %s.x, %s;",src0 + 0x38,local_118,buf + 0x38);
  }
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_POW(Context *ctx)
{
    // we can optimize this to use nv2's |abs| construct in some cases.
    if ( (ctx->source_args[0].src_mod == SRCMOD_NONE) ||
         (ctx->source_args[0].src_mod == SRCMOD_ABSNEGATE) )
        ctx->source_args[0].src_mod = SRCMOD_ABS;

    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));

    if (ctx->source_args[0].src_mod == SRCMOD_ABS)
        output_line(ctx, "POW%s, %s, %s;", dst, src0, src1);
    else
    {
        char buf[64]; allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "ABS %s, %s;", buf, src0);
        output_line(ctx, "POW%s, %s.x, %s;", dst, buf, src1);
    } // else

    emit_ARB1_dest_modifiers(ctx);
}